

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzv3dmesh.cpp
# Opt level: O0

void __thiscall TPZV3DGraphMesh::SequenceNodes(TPZV3DGraphMesh *this)

{
  TPZChunkVector<TPZGraphNode,_10> *this_00;
  TPZGraphNode *this_01;
  int64_t iVar1;
  long in_RDI;
  TPZGraphMesh *in_stack_00000010;
  TPZGraphNode *n;
  int64_t i;
  int64_t nnod;
  long nelem;
  
  TPZGraphMesh::SequenceNodes(in_stack_00000010);
  this_00 = (TPZChunkVector<TPZGraphNode,_10> *)
            TPZChunkVector<TPZGraphNode,_10>::NElements
                      ((TPZChunkVector<TPZGraphNode,_10> *)(in_RDI + 0x168));
  for (nelem = 0; nelem < (long)this_00; nelem = nelem + 1) {
    this_01 = TPZChunkVector<TPZGraphNode,_10>::operator[](this_00,nelem);
    if (this_01 != (TPZGraphNode *)0x0) {
      iVar1 = TPZGraphNode::FirstPoint(this_01);
      TPZGraphNode::SetPointNumber(this_01,iVar1 + 1);
    }
  }
  return;
}

Assistant:

void TPZV3DGraphMesh::SequenceNodes(){
	TPZGraphMesh::SequenceNodes();
	int64_t nnod = fNodeMap.NElements();
	for(int64_t i=0;i<nnod;i++) {
		TPZGraphNode *n = &fNodeMap[i];
		if(n) n->SetPointNumber(n->FirstPoint()+1);
	}
}